

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::EnumDescriptor::DebugStringWithOptions_abi_cxx11_
          (EnumDescriptor *this,DebugStringOptions *options)

{
  string *in_RDI;
  string *contents;
  DebugStringOptions *in_stack_00000ed8;
  string *in_stack_00000ee0;
  int in_stack_00000eec;
  EnumDescriptor *in_stack_00000ef0;
  
  std::__cxx11::string::string((string *)in_RDI);
  DebugString(in_stack_00000ef0,in_stack_00000eec,in_stack_00000ee0,in_stack_00000ed8);
  return in_RDI;
}

Assistant:

std::string EnumDescriptor::DebugStringWithOptions(
    const DebugStringOptions& options) const {
  std::string contents;
  DebugString(0, &contents, options);
  return contents;
}